

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenuPrivate::updateActionRects(QMenuPrivate *this,QRect *screen)

{
  QList<QRect> *this_00;
  short sVar1;
  uint uVar2;
  QWidget *pQVar3;
  Data *pDVar4;
  QWidget *this_01;
  Data *pDVar5;
  qsizetype qVar6;
  QIcon QVar7;
  QChar *pQVar8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  undefined1 uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  QStyle *pQVar22;
  Node<QAction_*,_QWidget_*> *pNVar23;
  long lVar24;
  QStyle *pQVar25;
  QSize QVar26;
  QSize QVar27;
  undefined8 uVar28;
  QArrayData *pQVar29;
  QSize QVar30;
  pointer pQVar31;
  short sVar32;
  uint uVar33;
  ushort uVar34;
  int extraout_EDX;
  Representation RVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  long lVar40;
  Representation RVar41;
  byte bVar42;
  long in_FS_OFFSET;
  QKeySequence seq;
  QIcon is_1;
  QIcon is;
  QAction *action_1;
  QFontMetrics qfm;
  QAction *action;
  QStyleOption opt;
  int local_1dc;
  ulong local_1d8;
  int local_1d0;
  int local_1b4;
  undefined1 *local_170;
  QString local_168;
  QIcon local_148;
  QChar *pQStack_140;
  QArrayData *local_138;
  undefined8 local_130;
  QAction *local_128;
  undefined1 *local_120;
  undefined1 local_118 [96];
  QArrayData *local_b8;
  QIcon local_a0 [2];
  QFont local_90 [24];
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x420 & 1) != 0) {
    pQVar3 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    QWidget::ensurePolished(pQVar3);
    this_00 = &this->actionRects;
    QList<QRect>::resize(this_00,(this->super_QWidgetPrivate).actions.d.size);
    local_118._0_8_ = (QArrayData *)0x0;
    local_118._8_4_ = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0xffffffff;
    local_118._12_4_ = ~LeftToRight;
    QList<QRect>::fill(this_00,(parameter_type)local_118,-1);
    uVar13 = getLastVisibleAction(this);
    pQVar22 = QWidget::style(pQVar3);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    iVar38 = 0;
    QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
    QStyleOption::initFrom((QStyleOption *)local_78,pQVar3);
    iVar14 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x1c,(QStyleOption *)local_78,pQVar3);
    iVar15 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x1d,(QStyleOption *)local_78,pQVar3);
    iVar16 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x3e,(QStyleOption *)local_78,pQVar3);
    iVar17 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x1e,(QStyleOption *)local_78,pQVar3);
    iVar18 = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x20,(QStyleOption *)local_78,pQVar3);
    local_1dc = 0;
    if ((this->field_0x421 & 2) != 0) {
      local_1dc = (**(code **)(*(long *)pQVar22 + 0xe0))(pQVar22,0x1f,local_78,pQVar3);
    }
    sVar32 = (this->super_QWidgetPrivate).topmargin;
    if (this->scroll != (QMenuScroller *)0x0) {
      iVar38 = this->scroll->scrollOffset;
    }
    iVar20 = (screen->y2).m_i;
    sVar1 = (this->super_QWidgetPrivate).bottommargin;
    iVar21 = (screen->y1).m_i;
    this->maxIconWidth = 0;
    this->tabWidth = 0;
    this->field_0x420 = this->field_0x420 & 0xfd;
    this->ncols = '\x01';
    if ((this->super_QWidgetPrivate).actions.d.size != 0) {
      uVar39 = 0;
      do {
        local_118._0_8_ = (this->super_QWidgetPrivate).actions.d.ptr[uVar39];
        cVar9 = QAction::isSeparator();
        if (((cVar9 == '\0') && (cVar9 = QAction::isVisible(), cVar9 != '\0')) &&
           ((pDVar4 = (this->widgetItems).d, pDVar4 == (Data *)0x0 ||
            (pNVar23 = QHashPrivate::Data<QHashPrivate::Node<QAction*,QWidget*>>::findNode<QAction*>
                                 ((Data<QHashPrivate::Node<QAction*,QWidget*>> *)pDVar4,
                                  (QAction **)local_118),
            pNVar23 == (Node<QAction_*,_QWidget_*> *)0x0)))) {
          cVar9 = QAction::isCheckable();
          uVar34 = *(ushort *)&this->field_0x420 & 2;
          if (cVar9 != '\0') {
            uVar34 = 2;
          }
          *(ushort *)&this->field_0x420 = *(ushort *)&this->field_0x420 & 0xfffd | uVar34;
          local_148.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          QAction::icon();
          cVar9 = QIcon::isNull();
          if (cVar9 == '\0') {
            uVar33 = this->maxIconWidth;
            if (this->maxIconWidth <= iVar16 + 4U) {
              uVar33 = iVar16 + 4U;
            }
            this->maxIconWidth = uVar33;
          }
          QIcon::~QIcon(&local_148);
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 < (ulong)(this->super_QWidgetPrivate).actions.d.size);
    }
    iVar38 = local_1dc + iVar15 + iVar17 + sVar32 + iVar38;
    iVar15 = ((iVar20 - (iVar15 + iVar17 + iVar18 * 2)) - (sVar1 + iVar21)) + 1;
    local_120 = &DAT_aaaaaaaaaaaaaaaa;
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_120,&pQVar3->data->fnt);
    topCausedWidget(this);
    lVar24 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    pQVar25 = QWidget::style(pQVar3);
    local_1d8._0_4_ = 0;
    iVar18 = (**(code **)(*(long *)pQVar25 + 0xf0))(pQVar25,0x61,0,pQVar3);
    if (-1 < (int)uVar13) {
      lVar40 = 0;
      bVar42 = 1;
      local_1d8 = 0;
      local_1b4 = iVar38;
      do {
        local_128 = *(QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar40);
        cVar9 = QAction::isSeparator();
        bVar10 = 1;
        if (cVar9 == '\0') {
LAB_00455341:
          bVar11 = QAction::isSeparator();
          bVar11 = bVar11 & bVar10;
        }
        else {
          QAction::text();
          if (local_118._16_8_ == 0) {
            QAction::icon();
            bVar10 = QIcon::isNull();
            QIcon::~QIcon(&local_148);
          }
          else {
            bVar10 = 0;
          }
          if ((QArrayData *)local_118._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_118._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_118._0_8_,2,0x10);
            }
          }
          bVar11 = 1;
          if ((iVar18 == 0 & (bVar10 ^ 1)) == 0) goto LAB_00455341;
        }
        cVar9 = QAction::isVisible();
        if (cVar9 != '\0') {
          if (((this->field_0x420 & 8) == 0) || ((bVar42 & bVar11) == 0)) {
            memset((QStyleOptionMenuItem *)local_118,0xaa,0x98);
            QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)local_118);
            (**(code **)(*(long *)pQVar3 + 0x1a0))
                      (pQVar3,(QStyleOptionMenuItem *)local_118,local_128);
            local_130 = 0xffffffffffffffff;
            pDVar4 = (this->widgetItems).d;
            if ((pDVar4 == (Data *)0x0) ||
               ((pNVar23 = QHashPrivate::Data<QHashPrivate::Node<QAction*,QWidget*>>::
                           findNode<QAction*>((Data<QHashPrivate::Node<QAction*,QWidget*>> *)pDVar4,
                                              &local_128),
                pNVar23 == (Node<QAction_*,_QWidget_*> *)0x0 ||
                (this_01 = pNVar23->value, this_01 == (QWidget *)0x0)))) {
              cVar9 = QAction::isSeparator();
              if (cVar9 == '\0') {
LAB_004554e2:
                local_138 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
                local_148.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
                pQStack_140 = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
                QAction::text();
                local_168.d.d = (Data *)local_138;
                local_168.d.ptr = &pQStack_140->ucs;
                pQVar29 = (QArrayData *)
                          QStringView::indexOf((QStringView *)&local_168,(QChar)0x9,0,CaseSensitive)
                ;
                if (pQVar29 == (QArrayData *)0xffffffffffffffff) {
                  cVar9 = QAction::isShortcutVisibleInContextMenu();
                  if ((lVar24 != 0) || (cVar9 != '\0')) {
                    local_170 = &DAT_aaaaaaaaaaaaaaaa;
                    QAction::shortcut();
                    cVar9 = QKeySequence::isEmpty();
                    if (cVar9 == '\0') {
                      uVar2 = this->tabWidth;
                      QKeySequence::toString((SequenceFormat)&local_168);
                      uVar19 = QFontMetrics::horizontalAdvance
                                         ((QString *)&local_120,(SequenceFormat)&local_168);
                      if ((int)uVar19 < (int)uVar2) {
                        uVar19 = uVar2;
                      }
                      this->tabWidth = uVar19;
                      if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_168.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_168.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
                        }
                      }
                    }
                    QKeySequence::~QKeySequence((QKeySequence *)&local_170);
                  }
                }
                else {
                  uVar2 = this->tabWidth;
                  QString::mid((longlong)&local_168,(longlong)&local_148);
                  uVar19 = QFontMetrics::horizontalAdvance
                                     ((QString *)&local_120,(int)(QStringView *)&local_168);
                  if ((int)uVar19 < (int)uVar2) {
                    uVar19 = uVar2;
                  }
                  this->tabWidth = uVar19;
                  if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_168.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (pQVar29 < local_138) {
                    QString::QString(&local_168,pQStack_140,(longlong)pQVar29);
                  }
                  else {
                    local_168.d.d = (Data *)local_148.d;
                    local_168.d.ptr = &pQStack_140->ucs;
                    local_168.d.size = (qsizetype)local_138;
                    if ((QArrayData *)local_148.d != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_148.d = *(int *)local_148.d + 1;
                      UNLOCK();
                    }
                  }
                  pQVar8 = pQStack_140;
                  QVar7.d = local_148.d;
                  qVar6 = local_168.d.size;
                  pDVar5 = local_168.d.d;
                  local_168.d.d = (Data *)local_148.d;
                  local_148.d = (QIconPrivate *)pDVar5;
                  pQStack_140 = (QChar *)local_168.d.ptr;
                  local_168.d.ptr = &pQVar8->ucs;
                  local_168.d.size = (qsizetype)local_138;
                  local_138 = (QArrayData *)qVar6;
                  if ((QArrayData *)QVar7.d != (QArrayData *)0x0) {
                    LOCK();
                    *(int *)QVar7.d = *(int *)QVar7.d + -1;
                    UNLOCK();
                    if (*(int *)QVar7.d == 0) {
                      QArrayData::deallocate((QArrayData *)QVar7.d,2,0x10);
                    }
                  }
                }
                local_168.d.d = (Data *)0x0;
                local_168.d.ptr = (storage_type_conflict *)0xffffffffffffffff;
                iVar20 = QFontMetrics::boundingRect
                                   ((QRect *)(local_118 + 0x20),(int)&local_168,(QString *)0x900,
                                    (int)&local_148,(int *)0x0);
                local_130 = CONCAT44(local_130._4_4_,(extraout_EDX - iVar20) + 1);
                iVar21 = QFontMetrics::height();
                iVar20 = QFontMetrics::height();
                if (iVar20 < iVar21) {
                  iVar20 = iVar21;
                }
                local_168.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_130._4_4_ = iVar20;
                QAction::icon();
                cVar9 = QIcon::isNull();
                if ((cVar9 == '\0') && (local_130._4_4_ < iVar16)) {
                  local_130._4_4_ = iVar16;
                }
                QIcon::~QIcon((QIcon *)&local_168);
                if ((QArrayData *)local_148.d != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_148.d = *(int *)local_148.d + -1;
                  UNLOCK();
                  if (*(int *)local_148.d == 0) {
                    QArrayData::deallocate((QArrayData *)local_148.d,2,0x10);
                  }
                }
              }
              else {
                QAction::text();
                pQVar29 = local_138;
                if ((QArrayData *)local_148.d != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_148.d = *(int *)local_148.d + -1;
                  UNLOCK();
                  if (*(int *)local_148.d == 0) {
                    QArrayData::deallocate((QArrayData *)local_148.d,2,0x10);
                  }
                }
                if (pQVar29 != (QArrayData *)0x0) goto LAB_004554e2;
                local_130._0_4_ = 2;
                local_130._4_4_ = 2;
              }
              local_130 = (**(code **)(*(long *)pQVar22 + 0xe8))(pQVar22,7,local_118,&local_130);
            }
            else {
              QVar26 = (QSize)(**(code **)(*(long *)this_01 + 0x70))(this_01);
              QVar27 = QWidget::minimumSize(this_01);
              QVar30 = QVar27;
              if (QVar27.wd.m_i.m_i < QVar26.wd.m_i.m_i) {
                QVar30 = QVar26;
              }
              RVar35.m_i = QVar27.ht.m_i.m_i;
              if (QVar27.ht.m_i.m_i < QVar26.ht.m_i.m_i) {
                RVar35.m_i = QVar26.ht.m_i.m_i;
              }
              uVar28 = (**(code **)(*(long *)this_01 + 0x78))(this_01);
              RVar41.m_i = QVar30.wd.m_i.m_i;
              if (QVar30.wd.m_i.m_i <= (int)(uint)uVar28) {
                RVar41.m_i = (uint)uVar28;
              }
              uVar33 = (uint)((ulong)uVar28 >> 0x20);
              if (RVar35.m_i <= (int)uVar33) {
                RVar35.m_i = uVar33;
              }
              QVar30 = QWidget::maximumSize(this_01);
              local_130 = (ulong)(uint)RVar41.m_i;
              if (QVar30.wd.m_i.m_i <= RVar41.m_i) {
                local_130 = (ulong)QVar30 & 0xffffffff;
              }
              uVar39 = (ulong)(uint)RVar35.m_i;
              if (QVar30.ht.m_i.m_i <= RVar35.m_i) {
                uVar39 = (ulong)QVar30 >> 0x20;
              }
              local_130 = local_130 | uVar39 << 0x20;
            }
            iVar21 = (int)local_130;
            iVar20 = (int)(local_130 >> 0x20);
            if (0 < iVar20 && 0 < iVar21) {
              if ((int)local_1d8 <= iVar21) {
                local_1d8 = local_130;
              }
              local_1d8 = local_1d8 & 0xffffffff;
              local_1b4 = local_1b4 + iVar20;
              if ((this->scroll == (QMenuScroller *)0x0) && (iVar15 < local_1b4)) {
                this->ncols = this->ncols + '\x01';
                local_1b4 = iVar38;
              }
              pQVar31 = QList<QRect>::data(this_00);
              *(undefined8 *)((long)&(pQVar31->x1).m_i + lVar40 * 2) = 0;
              *(int *)((long)&(pQVar31->x2).m_i + lVar40 * 2) = iVar21 + -1;
              *(int *)((long)&(pQVar31->y2).m_i + lVar40 * 2) = iVar20 + -1;
            }
            QFont::~QFont(local_90);
            QIcon::~QIcon(local_a0);
            if (local_b8 != (QArrayData *)0x0) {
              LOCK();
              (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_b8,2,0x10);
              }
            }
            QStyleOption::~QStyleOption((QStyleOption *)local_118);
            bVar42 = bVar11;
          }
          else {
            bVar42 = 1;
          }
        }
        lVar40 = lVar40 + 8;
      } while ((ulong)uVar13 * 8 + 8 != lVar40);
    }
    local_1d8._0_4_ = (int)local_1d8 + this->tabWidth;
    if (((this->field_0x421 & 4) == 0) || (this->scroll != (QMenuScroller *)0x0)) {
      local_118._0_8_ = (QArrayData *)0x0;
      iVar16 = (**(code **)(*(long *)pQVar22 + 0xe8))(pQVar22,10,local_78,local_118,pQVar3);
      QVar30 = QWidget::minimumSize(pQVar3);
      sVar32 = (this->super_QWidgetPrivate).leftmargin;
      iVar16 = QVar30.wd.m_i.m_i -
               (iVar16 + sVar32 + (iVar14 + iVar17) * 2 +
               (int)(this->super_QWidgetPrivate).rightmargin);
      if (iVar16 <= (int)local_1d8) {
        iVar16 = (int)local_1d8;
      }
    }
    else {
      sVar32 = (this->super_QWidgetPrivate).leftmargin;
      iVar16 = (int)local_1d8;
    }
    if ((this->super_QWidgetPrivate).actions.d.size != 0) {
      local_1d0 = (int)sVar32 + iVar17 + iVar14;
      lVar24 = 0;
      lVar40 = 0;
      uVar39 = 0;
      iVar17 = iVar38;
      do {
        pQVar31 = QList<QRect>::data(this_00);
        iVar18 = *(int *)((long)&(pQVar31->x1).m_i + lVar40 * 2);
        iVar20 = *(int *)((long)&(pQVar31->y1).m_i + lVar40 * 2);
        iVar21 = *(int *)((long)&(pQVar31->y2).m_i + lVar40 * 2);
        if ((*(int *)((long)&(pQVar31->x2).m_i + lVar40 * 2) != iVar18 + -1) ||
           (iVar21 != iVar20 + -1)) {
          if (this->scroll == (QMenuScroller *)0x0) {
            iVar36 = (iVar17 - iVar20) + iVar21 + 1;
            if (iVar15 < iVar36) {
              iVar17 = iVar38;
            }
            iVar37 = 0;
            if (iVar15 < iVar36) {
              iVar37 = iVar14 + iVar16;
            }
            local_1d0 = local_1d0 + iVar37;
          }
          iVar18 = iVar18 + local_1d0;
          *(int *)((long)&(pQVar31->x1).m_i + lVar40 * 2) = iVar18;
          *(int *)((long)&(pQVar31->y1).m_i + lVar40 * 2) = iVar20 + iVar17;
          *(int *)((long)&(pQVar31->y2).m_i + lVar40 * 2) = iVar21 + iVar17;
          *(int *)((long)&(pQVar31->x2).m_i + lVar40 * 2) = iVar18 + iVar16 + -1;
          pDVar4 = (this->widgetItems).d;
          if (((pDVar4 != (Data *)0x0) &&
              (pNVar23 = QHashPrivate::Data<QHashPrivate::Node<QAction*,QWidget*>>::
                         findNode<QAction*>((Data<QHashPrivate::Node<QAction*,QWidget*>> *)pDVar4,
                                            (QAction **)
                                            ((long)(this->super_QWidgetPrivate).actions.d.ptr +
                                            lVar40)), pNVar23 != (Node<QAction_*,_QWidget_*> *)0x0))
             && (pQVar3 = pNVar23->value, pQVar3 != (QWidget *)0x0)) {
            QWidget::setGeometry(pQVar3,(QRect *)((long)&(pQVar31->x1).m_i + lVar24));
            uVar12 = QAction::isVisible();
            (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,uVar12);
          }
          iVar17 = ((iVar17 + *(int *)((long)&(pQVar31->y2).m_i + lVar40 * 2)) -
                   *(int *)((long)&(pQVar31->y1).m_i + lVar40 * 2)) + 1;
        }
        uVar39 = uVar39 + 1;
        lVar40 = lVar40 + 8;
        lVar24 = lVar24 + 0x10;
      } while (uVar39 < (ulong)(this->super_QWidgetPrivate).actions.d.size);
    }
    this->field_0x420 = this->field_0x420 & 0xfe;
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_120);
    QStyleOption::~QStyleOption((QStyleOption *)local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::updateActionRects(const QRect &screen) const
{
    Q_Q(const QMenu);
    if (!itemsDirty)
        return;

    q->ensurePolished();

    //let's reinitialize the buffer
    actionRects.resize(actions.size());
    actionRects.fill(QRect());

    int lastVisibleAction = getLastVisibleAction();

    QStyle *style = q->style();
    QStyleOption opt;
    opt.initFrom(q);
    const int hmargin = style->pixelMetric(QStyle::PM_MenuHMargin, &opt, q),
              vmargin = style->pixelMetric(QStyle::PM_MenuVMargin, &opt, q),
              icone = style->pixelMetric(QStyle::PM_SmallIconSize, &opt, q);
    const int fw = style->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, q);
    const int deskFw = style->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, &opt, q);
    const int tearoffHeight = tearoff ? style->pixelMetric(QStyle::PM_MenuTearoffHeight, &opt, q) : 0;
    const int base_y = vmargin + fw + topmargin + (scroll ? scroll->scrollOffset : 0) + tearoffHeight;
    const int column_max_y = screen.height() - 2 * deskFw - (vmargin + bottommargin + fw);
    int max_column_width = 0;
    int y = base_y;

    //for compatibility now - will have to refactor this away
    tabWidth = 0;
    maxIconWidth = 0;
    hasCheckableItems = false;
    ncols = 1;

    for (int i = 0; i < actions.size(); ++i) {
        QAction *action = actions.at(i);
        if (action->isSeparator() || !action->isVisible() || widgetItems.contains(action))
            continue;
        //..and some members
        hasCheckableItems |= action->isCheckable();
        QIcon is = action->icon();
        if (!is.isNull()) {
            maxIconWidth = qMax<uint>(maxIconWidth, icone + 4);
        }
    }

    //calculate size
    QFontMetrics qfm = q->fontMetrics();
    bool previousWasSeparator = true; // this is true to allow removing the leading separators
#if QT_CONFIG(shortcut)
    const bool contextMenu = isContextMenu();
#endif
    const bool menuSupportsSections = q->style()->styleHint(QStyle::SH_Menu_SupportsSections, nullptr, q);
    for(int i = 0; i <= lastVisibleAction; i++) {
        QAction *action = actions.at(i);
        const bool isSection = action->isSeparator() && (!action->text().isEmpty() || !action->icon().isNull());
        const bool isPlainSeparator = (isSection && !menuSupportsSections)
                                   || (action->isSeparator() && !isSection);

        if (!action->isVisible() ||
            (collapsibleSeparators && previousWasSeparator && isPlainSeparator))
            continue; // we continue, this action will get an empty QRect

        previousWasSeparator = isPlainSeparator;

        //let the style modify the above size..
        QStyleOptionMenuItem opt;
        q->initStyleOption(&opt, action);
        const QFontMetrics &fm = opt.fontMetrics;

        QSize sz;
        if (QWidget *w = widgetItems.value(action)) {
          sz = w->sizeHint().expandedTo(w->minimumSize()).expandedTo(w->minimumSizeHint()).boundedTo(w->maximumSize());
        } else {
            //calc what I think the size is..
            if (action->isSeparator() && action->text().isEmpty()) {
                sz = QSize(2, 2);
            } else {
                QString s = action->text();
                qsizetype t = s.indexOf(u'\t');
                if (t != -1) {
                    tabWidth = qMax(int(tabWidth), qfm.horizontalAdvance(s.mid(t+1)));
                    s = s.left(t);
#if QT_CONFIG(shortcut)
                } else if (action->isShortcutVisibleInContextMenu() || !contextMenu) {
                    QKeySequence seq = action->shortcut();
                    if (!seq.isEmpty())
                        tabWidth = qMax(int(tabWidth), qfm.horizontalAdvance(seq.toString(QKeySequence::NativeText)));
#endif
                }
                sz.setWidth(fm.boundingRect(QRect(), Qt::TextSingleLine | Qt::TextShowMnemonic, s).width());
                sz.setHeight(qMax(fm.height(), qfm.height()));

                QIcon is = action->icon();
                if (!is.isNull()) {
                    QSize is_sz = QSize(icone, icone);
                    if (is_sz.height() > sz.height())
                        sz.setHeight(is_sz.height());
                }
            }
            sz = style->sizeFromContents(QStyle::CT_MenuItem, &opt, sz, q);
        }


        if (!sz.isEmpty()) {
            max_column_width = qMax(max_column_width, sz.width());
            //wrapping
            if (!scroll && y + sz.height() > column_max_y) {
                ncols++;
                y = base_y;
            } else {
                y += sz.height();
            }
            //update the item
            actionRects[i] = QRect(0, 0, sz.width(), sz.height());
        }
    }

    max_column_width += tabWidth; //finally add in the tab width
    if (!tornoff || scroll) { // exclude non-scrollable tear-off menu since the tear-off menu has a fixed size
        const int sfcMargin = style->sizeFromContents(QStyle::CT_Menu, &opt, QSize(0, 0), q).width();
        const int min_column_width = q->minimumWidth() - (sfcMargin + leftmargin + rightmargin + 2 * (fw + hmargin));
        max_column_width = qMax(min_column_width, max_column_width);
    }

    //calculate position
    int x = hmargin + fw + leftmargin;
    y = base_y;

    for(int i = 0; i < actions.size(); i++) {
        QRect &rect = actionRects[i];
        if (rect.isNull())
            continue;
        if (!scroll && y + rect.height() > column_max_y) {
            x += max_column_width + hmargin;
            y = base_y;
        }
        rect.translate(x, y);                        //move
        rect.setWidth(max_column_width); //uniform width

        //we need to update the widgets geometry
        if (QWidget *widget = widgetItems.value(actions.at(i))) {
            widget->setGeometry(rect);
            widget->setVisible(actions.at(i)->isVisible());
        }

        y += rect.height();
    }
    itemsDirty = 0;
}